

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

uint32_t __thiscall spirv_cross::CompilerMSL::build_constant_uint_array_pointer(CompilerMSL *this)

{
  ID id;
  uint32_t uVar1;
  SPIRType *pSVar2;
  uint32_t type_ptr_ptr_id;
  SPIRType uint_type_pointer;
  SPIRType uint_type_pointer2;
  uint32_t local_2c0;
  StorageClass local_2bc;
  undefined1 local_2b8 [192];
  uint *local_1f8;
  size_t local_1f0;
  uint local_1e0 [15];
  TypeID local_1a4;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1a0;
  undefined1 local_168 [192];
  uint *local_a8;
  size_t local_a0;
  uint local_90 [15];
  TypeID local_54;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_50;
  
  id.id = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,3);
  local_2c0 = id.id + 1;
  uVar1 = get_uint_type_id(this);
  pSVar2 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + uVar1);
  SPIRType::SPIRType((SPIRType *)local_2b8,pSVar2);
  local_2b8[0x7c] = true;
  local_2b8._120_4_ = local_2b8._120_4_ + 1;
  local_1a4.id = get_uint_type_id(this);
  local_2b8._128_4_ = StorageClassUniform;
  Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
            ((Compiler *)this,id.id,(SPIRType *)local_2b8);
  Compiler::set_decoration((Compiler *)this,id,DecorationArrayStride,4);
  SPIRType::SPIRType((SPIRType *)local_168,(SPIRType *)local_2b8);
  local_168._120_4_ = local_168._120_4_ + 1;
  local_54.id = id.id;
  Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
            ((Compiler *)this,local_2c0,(SPIRType *)local_168);
  local_2bc = StorageClassUniformConstant;
  Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
            ((Compiler *)this,id.id + 2,&local_2c0,&local_2bc);
  local_168._0_8_ = &PTR__SPIRType_003fd210;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_50);
  local_a0 = 0;
  if (local_a8 != local_90) {
    free(local_a8);
  }
  local_168._144_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_168._136_8_ !=
      (TypedID<(spirv_cross::Types)1> *)(local_168 + 0xa0)) {
    free((void *)local_168._136_8_);
  }
  local_168._96_8_ = 0;
  if ((undefined1 *)local_168._88_8_ != local_168 + 0x70) {
    free((void *)local_168._88_8_);
  }
  local_168._40_8_ = 0;
  if ((undefined1 *)local_168._32_8_ != local_168 + 0x38) {
    free((void *)local_168._32_8_);
  }
  local_2b8._0_8_ = &PTR__SPIRType_003fd210;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_1a0);
  local_1f0 = 0;
  if (local_1f8 != local_1e0) {
    free(local_1f8);
  }
  local_2b8._144_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_2b8._136_8_ !=
      (TypedID<(spirv_cross::Types)1> *)(local_2b8 + 0xa0)) {
    free((void *)local_2b8._136_8_);
  }
  local_2b8._96_8_ = 0;
  if ((undefined1 *)local_2b8._88_8_ != local_2b8 + 0x70) {
    free((void *)local_2b8._88_8_);
  }
  local_2b8._40_8_ = 0;
  if ((undefined1 *)local_2b8._32_8_ != local_2b8 + 0x38) {
    free((void *)local_2b8._32_8_);
  }
  return id.id + 2;
}

Assistant:

uint32_t CompilerMSL::build_constant_uint_array_pointer()
{
	uint32_t offset = ir.increase_bound_by(3);
	uint32_t type_ptr_id = offset;
	uint32_t type_ptr_ptr_id = offset + 1;
	uint32_t var_id = offset + 2;

	// Create a buffer to hold extra data, including the swizzle constants.
	SPIRType uint_type_pointer = get_uint_type();
	uint_type_pointer.pointer = true;
	uint_type_pointer.pointer_depth++;
	uint_type_pointer.parent_type = get_uint_type_id();
	uint_type_pointer.storage = StorageClassUniform;
	set<SPIRType>(type_ptr_id, uint_type_pointer);
	set_decoration(type_ptr_id, DecorationArrayStride, 4);

	SPIRType uint_type_pointer2 = uint_type_pointer;
	uint_type_pointer2.pointer_depth++;
	uint_type_pointer2.parent_type = type_ptr_id;
	set<SPIRType>(type_ptr_ptr_id, uint_type_pointer2);

	set<SPIRVariable>(var_id, type_ptr_ptr_id, StorageClassUniformConstant);
	return var_id;
}